

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCArg::RPCArg(RPCArg *this,string *name,Type type,Fallback *fallback,string *description,
              vector<RPCArg,_std::allocator<RPCArg>_> *inner,RPCArgOptions *opts)

{
  long lVar1;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int line;
  RPCArgOptions *in_R9;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffff58;
  RPCArgOptions *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined3 uVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool *in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffff90);
  *(int *)&in_RDI[1]._M_dataplus._M_p = in_EDX;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffff58,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)0x5a1992);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::variant(in_stack_ffffffffffffff58,
            (variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)0x5a19aa);
  std::__cxx11::string::string(in_RDI,in_RDI + 5);
  line = (int)((ulong)(in_RDI + 6) >> 0x20);
  RPCArgOptions::RPCArgOptions(in_R9,in_stack_ffffffffffffff60);
  uVar2 = (undefined3)in_stack_ffffffffffffffb0;
  uVar3 = CONCAT13(1,uVar2);
  if (((in_EDX != 1) && (uVar3 = CONCAT13(1,uVar2), in_EDX != 0)) &&
     (uVar3 = CONCAT13(1,uVar2), in_EDX != 5)) {
    uVar3 = CONCAT13(in_EDX == 6,uVar2);
  }
  inline_check_non_fatal<bool>
            (in_stack_ffffffffffffffb8,(char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),line,
             in_stack_00000008,(char *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCArg(
        std::string name,
        Type type,
        Fallback fallback,
        std::string description,
        std::vector<RPCArg> inner,
        RPCArgOptions opts = {})
        : m_names{std::move(name)},
          m_type{std::move(type)},
          m_inner{std::move(inner)},
          m_fallback{std::move(fallback)},
          m_description{std::move(description)},
          m_opts{std::move(opts)}
    {
        CHECK_NONFATAL(type == Type::ARR || type == Type::OBJ || type == Type::OBJ_NAMED_PARAMS || type == Type::OBJ_USER_KEYS);
    }